

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O0

int32_t __thiscall caldate_t::dayno(caldate_t *this)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int *in_RDI;
  int y;
  int m;
  div_t mq;
  div_t local_10;
  
  local_10 = div(in_RDI[1] + -3,0xc);
  if ((long)local_10 < 0) {
    local_10.rem = local_10.rem + 0xc;
    local_10.quot = local_10.quot + -1;
  }
  iVar1 = *in_RDI;
  iVar2 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  iVar3 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  iVar4 = divfl((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  return (((iVar1 + local_10.quot) * 0x16d + iVar2) - iVar3) + iVar4 +
         (local_10.rem * 0x132 + 5) / 10 + in_RDI[2] + -1;
}

Assistant:

int32_t dayno() const
    {
        /* 
         *   Adjust the month to our odd range where the year starts in
         *   March: 0 = March, 1 = April, ... 11 = Feb.  (If this yields a
         *   negative remainder, adjust to a positive index by going back a
         *   year.)
         */
        div_t mq = div(this->m - 3, 12);
        if (mq.rem < 0)
            mq.rem += 12, mq.quot -= 1;

        int m = mq.rem;
        int y = this->y + mq.quot;
        return 365*y + divfl(y, 4) - divfl(y, 100) + divfl(y, 400)
            + (m*306 + 5)/10 + (d-1);
    }